

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ConcaveCornerOption __thiscall
ON_SubDFromMeshParameters::GetConcaveCornerOption(ON_SubDFromMeshParameters *this)

{
  undefined2 uVar1;
  ConcaveCornerOption CVar2;
  
  CVar2 = this->m_concave_corner_option;
  if ((None < CVar2) &&
     ((((CVar2 != AtMeshCorner ||
        (uVar1 = this->m_minimum_concave_corner_edge_count, 0xffee < (ushort)(uVar1 - 2))) ||
       (this->m_minimum_concave_corner_angle_radians <= 3.141592653589793)) ||
      (CVar2 = AtMeshCorner, 6.283185307179586 < this->m_minimum_concave_corner_angle_radians)))) {
    return Unset;
  }
  return CVar2;
}

Assistant:

ON_SubDFromMeshParameters::ConcaveCornerOption ON_SubDFromMeshParameters::GetConcaveCornerOption() const
{
  switch (m_concave_corner_option)
  {
  case ON_SubDFromMeshParameters::ConcaveCornerOption::Unset:
  case ON_SubDFromMeshParameters::ConcaveCornerOption::None:
    return m_concave_corner_option;

  case ON_SubDFromMeshParameters::ConcaveCornerOption::AtMeshCorner:
    if (m_minimum_concave_corner_edge_count >= 2
      && m_minimum_concave_corner_edge_count <= ON_SubDVertex::MaximumEdgeCount
      && m_minimum_concave_corner_angle_radians > ON_PI
      && m_minimum_concave_corner_angle_radians <= ON_2PI
      )
      return m_concave_corner_option;
    break;
  }

  return ON_SubDFromMeshParameters::ConcaveCornerOption::Unset;
}